

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

scalar __thiscall
absl::make_unique<S2Polyline::Shape,S2Polyline_const*>(absl *this,S2Polyline **args)

{
  S2Polyline *polyline;
  Shape *this_00;
  
  this_00 = (Shape *)operator_new(0x18);
  polyline = *args;
  (this_00->super_S2Shape).id_ = -1;
  (this_00->super_S2Shape)._vptr_S2Shape = (_func_int **)&PTR__S2Shape_002c2d20;
  S2Polyline::Shape::Init(this_00,polyline);
  *(Shape **)this = this_00;
  return (__uniq_ptr_data<S2Polyline::Shape,_std::default_delete<S2Polyline::Shape>,_true,_true>)
         (__uniq_ptr_data<S2Polyline::Shape,_std::default_delete<S2Polyline::Shape>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}